

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rematch.cpp
# Opt level: O0

REStackFrame * __thiscall icu_63::RegexMatcher::resetStack(RegexMatcher *this)

{
  UBool UVar1;
  int local_24;
  int32_t i;
  REStackFrame *iFrame;
  RegexMatcher *this_local;
  
  UVector64::removeAllElements(this->fStack);
  this_local = (RegexMatcher *)
               UVector64::reserveBlock
                         (this->fStack,this->fPattern->fFrameSize,&this->fDeferredStatus);
  UVar1 = ::U_FAILURE(this->fDeferredStatus);
  if (UVar1 == '\0') {
    for (local_24 = 0; local_24 < this->fPattern->fFrameSize + -2; local_24 = local_24 + 1) {
      (&this_local->fPatternOwned)[local_24] = (RegexPattern *)0xffffffffffffffff;
    }
  }
  else {
    this_local = (RegexMatcher *)0x0;
  }
  return (REStackFrame *)this_local;
}

Assistant:

REStackFrame *RegexMatcher::resetStack() {
    // Discard any previous contents of the state save stack, and initialize a
    //  new stack frame with all -1 data.  The -1s are needed for capture group limits,
    //  where they indicate that a group has not yet matched anything.
    fStack->removeAllElements();

    REStackFrame *iFrame = (REStackFrame *)fStack->reserveBlock(fPattern->fFrameSize, fDeferredStatus);
    if(U_FAILURE(fDeferredStatus)) {
        return NULL;
    }

    int32_t i;
    for (i=0; i<fPattern->fFrameSize-RESTACKFRAME_HDRCOUNT; i++) {
        iFrame->fExtra[i] = -1;
    }
    return iFrame;
}